

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ChElementShellANCF_3833(ChElementShellANCF_3833 *this)

{
  undefined1 auVar1 [32];
  
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K =
       (ChMatrixDynamic<double>)auVar1._0_24_;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar1;
  (this->super_ChElementShell).mass = 0.0;
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0x1183828;
  this->super_ChLoadableUV = (ChLoadableUV)0x11839f0;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x1183ae8;
  this->m_method = ContInt;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->m_lenX = (double)auVar1._0_8_;
  this->m_lenY = (double)auVar1._8_8_;
  this->m_thicknessZ = (double)auVar1._16_8_;
  this->m_midsurfoffset = (double)auVar1._24_8_;
  *(undefined1 (*) [32])((long)&this->m_lenY + 1) = auVar1;
  this->m_SD = (Matrix<double,__1,__1,_1,__1,__1>)auVar1._0_24_;
  (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)auVar1._24_8_;
  *(undefined1 (*) [32])
   &(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       auVar1;
  (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
  ::resize(&this->m_nodes,8);
  return;
}

Assistant:

ChElementShellANCF_3833::ChElementShellANCF_3833()
    : m_method(IntFrcMethod::ContInt),
      m_numLayers(0),
      m_lenX(0),
      m_lenY(0),
      m_thicknessZ(0),
      m_midsurfoffset(0),
      m_Alpha(0),
      m_damping_enabled(false) {
    m_nodes.resize(8);
}